

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeachLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ForeachLoopListSyntax&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          ForeachLoopListSyntax *args_3,StatementSyntax *args_4)

{
  Token keyword;
  ForeachLoopStatementSyntax *this_00;
  StatementSyntax *args_local_4;
  ForeachLoopListSyntax *args_local_3;
  Token *args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  NamedLabelSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (ForeachLoopStatementSyntax *)allocate(this,0x68,8);
  keyword.kind = args_2->kind;
  keyword._2_1_ = args_2->field_0x2;
  keyword.numFlags.raw = (args_2->numFlags).raw;
  keyword.rawLen = args_2->rawLen;
  keyword.info = args_2->info;
  slang::syntax::ForeachLoopStatementSyntax::ForeachLoopStatementSyntax
            (this_00,*args,args_1,keyword,args_3,args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }